

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

void SVGChart::MakeExamplePlot3(PPlot *ioPPlot)

{
  iterator iVar1;
  PPlot *pPVar2;
  undefined8 *puVar3;
  PlotDataBase *inYData;
  int theI;
  int iVar4;
  float fVar5;
  float local_40;
  float local_3c;
  PPlot *local_38;
  
  local_38 = ioPPlot;
  puVar3 = (undefined8 *)operator_new(0x20);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = &PTR__PlotData_00112bf0;
  inYData = (PlotDataBase *)operator_new(0x20);
  inYData->_vptr_PlotDataBase = (_func_int **)0x0;
  inYData[1]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[2]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[3]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00112bf0;
  iVar4 = 0;
  do {
    fVar5 = (float)iVar4;
    iVar1._M_current = (float *)puVar3[2];
    local_3c = fVar5;
    if (iVar1._M_current == (float *)puVar3[3]) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(puVar3 + 1),iVar1,&local_3c);
    }
    else {
      *iVar1._M_current = fVar5;
      puVar3[2] = iVar1._M_current + 1;
    }
    local_40 = fVar5 * 1e-06 * fVar5 * fVar5;
    iVar1._M_current = (float *)inYData[2]._vptr_PlotDataBase;
    if ((_func_int **)iVar1._M_current == inYData[3]._vptr_PlotDataBase) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(inYData + 1),iVar1,&local_40);
    }
    else {
      *iVar1._M_current = local_40;
      inYData[2]._vptr_PlotDataBase = (_func_int **)(iVar1._M_current + 1);
    }
    pPVar2 = local_38;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x65);
  PlotDataContainer::AddXYPlot
            (&local_38->mPlotDataContainer,(PlotDataBase *)0x0,inYData,(LegendData *)0x0,
             (DataDrawerBase *)0x0,(PlotDataSelection *)0x0);
  std::__cxx11::string::_M_replace
            ((ulong)&(pPVar2->mPlotBackground).mTitle,0,
             (char *)(pPVar2->mPlotBackground).mTitle._M_string_length,0x10d425);
  (pPVar2->mPlotBackground).mTransparent = false;
  (pPVar2->mPlotBackground).mPlotRegionBackColor.mR = 200;
  (pPVar2->mPlotBackground).mPlotRegionBackColor.mG = 200;
  (pPVar2->mPlotBackground).mPlotRegionBackColor.mB = 200;
  (pPVar2->mMargins).mTop = 0x14;
  (pPVar2->mMargins).mRight = 10;
  (pPVar2->mMargins).mLeft = 10;
  (pPVar2->mMargins).mBottom = 10;
  return;
}

Assistant:

void MakeExamplePlot3 (PPlot &ioPPlot) {

      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 1.0f/(100*100*100);
      for (int theI=0;theI<=100;theI++) {
        //    theX1->push_back (theI*0.001);
        theX1->push_back (theI);
        theY1->push_back (theFac*theI*theI*theI);
      }
      ioPPlot.mPlotDataContainer.AddXYPlot (nullptr, theY1, nullptr);

      ioPPlot.mPlotBackground.mTitle = "narrow margins";
      ioPPlot.mPlotBackground.mTransparent = false;
      ioPPlot.mPlotBackground.mPlotRegionBackColor = PColor (200,200,200);
      ioPPlot.mMargins.mTop = 20;
      ioPPlot.mMargins.mRight = 10;
      ioPPlot.mMargins.mLeft = 10;
      ioPPlot.mMargins.mBottom = 10;
    }